

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurse.cpp
# Opt level: O2

string * __thiscall Nurse::Field_getter_abi_cxx11_(string *__return_storage_ptr__,Nurse *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Field);
  return __return_storage_ptr__;
}

Assistant:

string Nurse :: Field_getter(){
    return Field;
}